

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O0

void d68020_cptrapcc_32(m68k_info *info)

{
  uint uVar1;
  uint uVar2;
  cs_m68k *pcVar3;
  anon_union_8_5_85a7a27f_for_cs_m68k_op_0 aVar4;
  long in_RDI;
  cs_m68k_op *op0;
  cs_m68k *ext;
  uint extension2;
  uint extension1;
  m68k_info *in_stack_ffffffffffffffe0;
  undefined8 in_stack_ffffffffffffffe8;
  
  if ((*(uint *)(in_RDI + 0x28) & 0x1c) == 0) {
    d68000_invalid((m68k_info *)0x3a8343);
  }
  else {
    uVar1 = read_imm_16(in_stack_ffffffffffffffe0);
    uVar2 = read_imm_32(in_stack_ffffffffffffffe0);
    pcVar3 = build_init_op((m68k_info *)CONCAT44(uVar1,uVar2),
                           (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
                           (int)in_stack_ffffffffffffffe8,
                           (int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    *(uint *)(*(long *)(in_RDI + 0x18) + 8) =
         (uVar1 & 0x2f) + *(int *)(*(long *)(in_RDI + 0x18) + 8);
    pcVar3->operands[0].address_mode = M68K_AM_IMMEDIATE;
    pcVar3->operands[0].type = M68K_OP_IMM;
    aVar4.reg_pair.reg_1 = 0;
    aVar4.reg = uVar2;
    pcVar3->operands[0].field_0 = aVar4;
  }
  return;
}

Assistant:

static void d68020_cptrapcc_32(m68k_info *info)
{
	uint extension1, extension2;
	cs_m68k* ext;
	cs_m68k_op* op0;

	LIMIT_CPU_TYPES(info, M68020_PLUS);

	extension1 = read_imm_16(info);
	extension2 = read_imm_32(info);

	ext = build_init_op(info, M68K_INS_FTRAPF, 1, 2);

	// these are all in row with the extension so just doing a add here is fine
	info->inst->Opcode += (extension1 & 0x2f);

	op0 = &ext->operands[0];

	op0->address_mode = M68K_AM_IMMEDIATE;
	op0->type = M68K_OP_IMM;
	op0->imm = extension2;
}